

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O0

void SplitVarnode::createBinaryOp
               (Funcdata *data,SplitVarnode *out,SplitVarnode *in1,SplitVarnode *in2,
               PcodeOp *existop,OpCode opc)

{
  OpCode OVar1;
  Address *pc;
  PcodeOp *op;
  Varnode *pVVar2;
  PcodeOp *newop;
  OpCode opc_local;
  PcodeOp *existop_local;
  SplitVarnode *in2_local;
  SplitVarnode *in1_local;
  SplitVarnode *out_local;
  Funcdata *data_local;
  
  findCreateOutputWhole(out,data);
  findCreateWhole(in1,data);
  findCreateWhole(in2,data);
  OVar1 = PcodeOp::code(existop);
  if (OVar1 == CPUI_PIECE) {
    Funcdata::opSetOpcode(data,existop,opc);
    pVVar2 = getWhole(in1);
    Funcdata::opSetInput(data,existop,pVVar2,0);
    pVVar2 = getWhole(in2);
    Funcdata::opSetInput(data,existop,pVVar2,1);
  }
  else {
    pc = PcodeOp::getAddr(existop);
    op = Funcdata::newOp(data,2,pc);
    Funcdata::opSetOpcode(data,op,opc);
    pVVar2 = getWhole(out);
    Funcdata::opSetOutput(data,op,pVVar2);
    pVVar2 = getWhole(in1);
    Funcdata::opSetInput(data,op,pVVar2,0);
    pVVar2 = getWhole(in2);
    Funcdata::opSetInput(data,op,pVVar2,1);
    Funcdata::opInsertBefore(data,op,existop);
    buildLoFromWhole(out,data);
    buildHiFromWhole(out,data);
  }
  return;
}

Assistant:

void SplitVarnode::createBinaryOp(Funcdata &data,SplitVarnode &out,SplitVarnode &in1,SplitVarnode &in2,
				  PcodeOp *existop,OpCode opc)

{ // Rewrite the double precision operation (if possible) by replacing the pieces with unified varnodes
  // Make sure all the actual whole varnodes exist
  out.findCreateOutputWhole(data);
  in1.findCreateWhole(data);
  in2.findCreateWhole(data);
  if (existop->code() != CPUI_PIECE) { // If the output whole didn't previously exist
    PcodeOp *newop = data.newOp(2,existop->getAddr()); // new op which creates the output whole
    data.opSetOpcode(newop,opc);
    data.opSetOutput(newop,out.getWhole());
    data.opSetInput(newop,in1.getWhole(),0);
    data.opSetInput(newop,in2.getWhole(),1);
    data.opInsertBefore(newop,existop);
    out.buildLoFromWhole(data);
    out.buildHiFromWhole(data);
  }
  else {			// The whole previously existed
    data.opSetOpcode(existop,opc); // our new op replaces the op previously defining the output whole
    data.opSetInput(existop,in1.getWhole(),0);
    data.opSetInput(existop,in2.getWhole(),1);
  }
}